

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

int __thiscall QObject::startTimer(QObject *this,nanoseconds interval,TimerType timerType)

{
  QObjectPrivate *this_00;
  __pointer_type pQVar1;
  QThread *pQVar2;
  TimerId t;
  QThread *pQVar3;
  char *msg;
  long in_FS_OFFSET;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QObjectPrivate *)(this->d_ptr).d;
  if (interval.__r < 0) {
    local_58.context.version = 2;
    local_58.context.function._4_4_ = 0;
    local_58.context._4_8_ = 0;
    local_58.context._12_8_ = 0;
    local_58.context.category = "default";
    QMessageLogger::warning
              (&local_58,
               "QObject::startTimer: negative intervals aren\'t allowed; the interval will be set to 1ms."
              );
    interval.__r = 1000000;
  }
  pQVar1 = (this_00->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p;
  if (((__pointer_type)
      (pQVar1->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value._M_b).
      _M_p == (__pointer_type)0x0) {
    msg = "QObject::startTimer: Timers can only be used with threads started with QThread";
  }
  else {
    pQVar2 = (QThread *)(this->d_ptr).d[1].q_ptr[5]._vptr_QObject;
    pQVar3 = QThread::currentThread();
    if (pQVar3 == pQVar2) {
      t = QAbstractEventDispatcher::registerTimer
                    ((QAbstractEventDispatcher *)
                     (pQVar1->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>.
                     _q_value._M_b,(Duration)interval.__r,timerType,this);
      QObjectPrivate::ensureExtraData(this_00);
      QList<Qt::TimerId>::append(&this_00->extraData->runningTimers,t);
      goto LAB_0028a22e;
    }
    msg = "QObject::startTimer: Timers cannot be started from another thread";
  }
  local_58.context.category = "default";
  local_58.context.function._4_4_ = 0;
  local_58.context._12_8_ = 0;
  local_58.context._4_8_ = 0;
  local_58.context.version = 2;
  t = Invalid;
  QMessageLogger::warning(&local_58,msg);
LAB_0028a22e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return t;
  }
  __stack_chk_fail();
}

Assistant:

int QObject::startTimer(std::chrono::nanoseconds interval, Qt::TimerType timerType)
{
    Q_D(QObject);

    using namespace std::chrono_literals;

    if (interval < 0ns) {
        qWarning("QObject::startTimer: negative intervals aren't allowed; the "
                 "interval will be set to 1ms.");
        interval = 1ms;
    }

    auto thisThreadData = d->threadData.loadRelaxed();
    if (Q_UNLIKELY(!thisThreadData->hasEventDispatcher())) {
        qWarning("QObject::startTimer: Timers can only be used with threads started with QThread");
        return 0;
    }
    if (Q_UNLIKELY(thread() != QThread::currentThread())) {
        qWarning("QObject::startTimer: Timers cannot be started from another thread");
        return 0;
    }

    auto dispatcher = thisThreadData->eventDispatcher.loadRelaxed();
    Qt::TimerId timerId = dispatcher->registerTimer(interval, timerType, this);
    d->ensureExtraData();
    d->extraData->runningTimers.append(timerId);
    return int(timerId);
}